

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_vector_unittest.cpp
# Opt level: O1

void __thiscall HostVector_constructor_Test::TestBody(HostVector_constructor_Test *this)

{
  bool bVar1;
  int iVar2;
  int i;
  long lVar3;
  void *__ptr;
  char *pcVar4;
  ulong uVar5;
  AssertionResult gtest_ar;
  HostVector<float> v3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  AssertHelper local_70;
  ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
  local_68;
  void *local_50;
  void *local_48;
  ulong uStack_40;
  
  iVar2 = posix_memalign(&local_50,8,400);
  lVar3 = 0;
  __ptr = (void *)0x0;
  if (iVar2 == 0) {
    __ptr = local_50;
  }
  do {
    *(float *)((long)__ptr + lVar3 * 4) = (float)(int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  local_68.
  super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
  .pointer_ = (pointer)((long)__ptr + 0x168);
  local_68.
  super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
  .size_ = 10;
  memory::
  Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>
  ::
  Array<memory::ArrayReference<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>,void>
            ((Array<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<8ul>>>>
              *)&local_50,&local_68);
  lVar3 = 0x168;
  do {
    *(undefined4 *)((long)__ptr + lVar3) = 0xbf800000;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 400);
  lVar3 = 0;
  uVar5 = 0;
  do {
    local_78.ptr_._0_4_ = (float)((int)uVar5 + 0x5a);
    if (uStack_40 <= uVar5) {
      __assert_fail("i<size_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/include/ArrayView.hpp"
                    ,0x186,
                    "reference memory::ArrayViewImpl<memory::ArrayReference<float, memory::HostCoordinator<float>>, float, memory::HostCoordinator<float>>::operator[](size_type) [R = memory::ArrayReference<float, memory::HostCoordinator<float>>, T = float, Coord = memory::HostCoordinator<float>]"
                   );
    }
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_68,"float(i+90)","v3[i]",(float *)&local_78,
               (float *)((long)local_48 + lVar3));
    if ((internal)
        local_68.
        super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
        ._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      pcVar4 = "";
      if (local_68.
          super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
          .pointer_ != (pointer)0x0) {
        pcVar4 = *(char **)local_68.
                           super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
                           .pointer_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
                 ,0x28,pcVar4);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_78.ptr_ + 8))();
        }
        local_78.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_68.
              super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
              .pointer_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar5 = uVar5 + 1;
    lVar3 = lVar3 + 4;
  } while (uVar5 != 10);
  lVar3 = 0x168;
  do {
    local_78.ptr_._0_4_ = -1.0;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_68,"float(-1)","v1[i]",(float *)&local_78,
               (float *)((long)__ptr + lVar3));
    if ((internal)
        local_68.
        super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
        ._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      pcVar4 = "";
      if (local_68.
          super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
          .pointer_ != (pointer)0x0) {
        pcVar4 = *(char **)local_68.
                           super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
                           .pointer_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/host_vector_unittest.cpp"
                 ,0x2b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_78.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_78.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_78.ptr_ + 8))();
        }
        local_78.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_68.
              super_ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<8UL>_>_>_>
              .pointer_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 400);
  if (local_48 != (void *)0x0) {
    free(local_48);
  }
  local_48 = (void *)0x0;
  uStack_40 = 0;
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

TEST(HostVector, constructor) {
    using namespace memory;

    // default constructor
    HostVector<float> v2;

    // length constructor
    HostVector<float> v1(100);

    // initialize values as monotone sequence
    for(int i=0; i<v1.size(); ++i)
        v1[i] = float(i);

    // initialize new HostVector from a subrange
    HostVector<float> v3(v1(90, 100));

    // reset values in range
    for(auto &v : v1(90, 100))
        v = float(-1.0);

    // check that v3 has values originally copied over from v1
    for(int i=0; i<10; i++)
        EXPECT_EQ(float(i+90), v3[i]);

    for(int i=90; i<100; i++)
        EXPECT_EQ(float(-1), v1[i]);
}